

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

RK_S32 compare_pic_by_pic_num_desc(void *arg1,void *arg2)

{
  RK_S32 pic_num2;
  RK_S32 pic_num1;
  void *arg2_local;
  void *arg1_local;
  
  if (*(int *)(*arg1 + 0x18) < *(int *)(*arg2 + 0x18)) {
    arg1_local._4_4_ = 1;
  }
  else if (*(int *)(*arg2 + 0x18) < *(int *)(*arg1 + 0x18)) {
    arg1_local._4_4_ = -1;
  }
  else {
    arg1_local._4_4_ = 0;
  }
  return arg1_local._4_4_;
}

Assistant:

static RK_S32 compare_pic_by_pic_num_desc(const void *arg1, const void *arg2)
{
    RK_S32 pic_num1 = (*(H264_StorePic_t**)arg1)->pic_num;
    RK_S32 pic_num2 = (*(H264_StorePic_t**)arg2)->pic_num;

    if (pic_num1 < pic_num2)
        return 1;
    if (pic_num1 > pic_num2)
        return -1;
    else
        return 0;
}